

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::Vector<kj::ArrayPtr<const_capnp::word>_>::~Vector
          (Vector<kj::ArrayPtr<const_capnp::word>_> *this)

{
  ArrayPtr<const_capnp::word> *pAVar1;
  RemoveConst<kj::ArrayPtr<const_capnp::word>_> *pRVar2;
  ArrayPtr<const_capnp::word> *pAVar3;
  ArrayDisposer *pAVar4;
  
  pAVar1 = (this->builder).ptr;
  if (pAVar1 != (ArrayPtr<const_capnp::word> *)0x0) {
    pRVar2 = (this->builder).pos;
    pAVar3 = (this->builder).endPtr;
    (this->builder).ptr = (ArrayPtr<const_capnp::word> *)0x0;
    (this->builder).pos = (RemoveConst<kj::ArrayPtr<const_capnp::word>_> *)0x0;
    (this->builder).endPtr = (ArrayPtr<const_capnp::word> *)0x0;
    pAVar4 = (this->builder).disposer;
    (*(code *)**(undefined8 **)pAVar4)
              (pAVar4,pAVar1,0x10,(long)pRVar2 - (long)pAVar1 >> 4,(long)pAVar3 - (long)pAVar1 >> 4,
               0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }